

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O0

void stackjit::anon_unknown_3::addData<unsigned_long>(BinaryData *data,unsigned_long value)

{
  ulong local_28;
  size_t i;
  char *valuePtr;
  unsigned_long value_local;
  BinaryData *data_local;
  
  valuePtr = (char *)value;
  value_local = (unsigned_long)data;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)value_local,
               (value_type *)((long)&valuePtr + local_28));
  }
  return;
}

Assistant:

void addData(BinaryData& data, T value) {
			auto valuePtr = reinterpret_cast<char*>(&value);

			for (std::size_t i = 0; i < sizeof(T); i++) {
				data.push_back(valuePtr[i]);
			}
		}